

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

void __thiscall DFraggleThinker::AddRunningScript(DFraggleThinker *this,DRunningScript *runscr)

{
  DRunningScript *pDVar1;
  DRunningScript *runscr_local;
  DFraggleThinker *this_local;
  
  pDVar1 = TObjPtr<DRunningScript>::operator->(&this->RunningScripts);
  (runscr->next).field_0 = (pDVar1->next).field_0;
  pDVar1 = TObjPtr<DRunningScript>::operator->(&this->RunningScripts);
  pDVar1 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&pDVar1->next);
  GC::WriteBarrier(&runscr->super_DObject,&pDVar1->super_DObject);
  (runscr->prev).field_0 = (this->RunningScripts).field_0;
  pDVar1 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&this->RunningScripts);
  GC::WriteBarrier(&runscr->super_DObject,&pDVar1->super_DObject);
  pDVar1 = TObjPtr<DRunningScript>::operator->(&runscr->prev);
  TObjPtr<DRunningScript>::operator=(&pDVar1->next,runscr);
  pDVar1 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&runscr->prev);
  GC::WriteBarrier(&pDVar1->super_DObject,&runscr->super_DObject);
  pDVar1 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&runscr->next);
  if (pDVar1 != (DRunningScript *)0x0) {
    pDVar1 = TObjPtr<DRunningScript>::operator->(&runscr->next);
    TObjPtr<DRunningScript>::operator=(&pDVar1->prev,runscr);
    pDVar1 = ::TObjPtr::operator_cast_to_DRunningScript_((TObjPtr *)&runscr->next);
    GC::WriteBarrier(&pDVar1->super_DObject,&runscr->super_DObject);
  }
  return;
}

Assistant:

void DFraggleThinker::AddRunningScript(DRunningScript *runscr)
{
	runscr->next = RunningScripts->next;
	GC::WriteBarrier(runscr, RunningScripts->next);

	runscr->prev = RunningScripts;
	GC::WriteBarrier(runscr, RunningScripts);

	runscr->prev->next = runscr;
	GC::WriteBarrier(runscr->prev, runscr);

	if(runscr->next)
	{
		runscr->next->prev = runscr;
		GC::WriteBarrier(runscr->next, runscr);
	}
}